

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.cpp
# Opt level: O2

size_t embree::mapThreadID(size_t threadID)

{
  int i_2;
  int iVar1;
  pthread_t __th;
  long *plVar2;
  int *piVar3;
  ulong uVar4;
  int j_1;
  size_t i_1;
  size_t j;
  long lVar5;
  ulong uVar6;
  long lVar7;
  size_t sVar8;
  long __val;
  allocator local_302;
  allocator local_301;
  size_t local_300;
  Lock<embree::MutexSys> lock;
  string cpu;
  string local_2c8;
  int i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  cpu_set_t set;
  
  lock.mutex = (MutexSys *)&mutex;
  lock.locked = true;
  MutexSys::lock((MutexSys *)&mutex);
  piVar3 = DAT_02223eb8;
  if (DAT_02223eb8 == threadIDs) {
    __val = 0;
    local_300 = threadID;
    while( true ) {
      std::fstream::fstream((istream *)&set);
      std::__cxx11::string::string((string *)&i,"/sys/devices/system/cpu/cpu",&local_301);
      std::__cxx11::to_string(&local_2c8,__val);
      std::operator+(&local_288,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i,
                     &local_2c8);
      std::__cxx11::string::string((string *)&local_268,"/topology/thread_siblings_list",&local_302)
      ;
      std::operator+(&cpu,&local_288,&local_268);
      std::__cxx11::string::~string((string *)&local_268);
      std::__cxx11::string::~string((string *)&local_288);
      std::__cxx11::string::~string((string *)&local_2c8);
      std::__cxx11::string::~string((string *)&i);
      std::fstream::open((char *)&set,(_Ios_Openmode)cpu._M_dataplus._M_p);
      if ((*(byte *)((long)set.__bits + *(long *)(set.__bits[0] - 0x18) + 0x20) & 5) != 0) break;
      while (plVar2 = (long *)std::istream::operator>>((istream *)&set,&i),
            (*(byte *)((long)plVar2 + *(long *)(*plVar2 + -0x18) + 0x20) & 5) == 0) {
        lVar5 = (long)DAT_02223eb8 - (long)threadIDs;
        piVar3 = threadIDs;
        for (lVar7 = lVar5 >> 5; 0 < lVar7; lVar7 = lVar7 + -1) {
          if (i == *piVar3) goto LAB_01f42255;
          if (i == piVar3[2]) {
            piVar3 = piVar3 + 2;
            goto LAB_01f42255;
          }
          if (i == piVar3[4]) {
            piVar3 = piVar3 + 4;
            goto LAB_01f42255;
          }
          if (i == piVar3[6]) {
            piVar3 = piVar3 + 6;
            goto LAB_01f42255;
          }
          piVar3 = piVar3 + 8;
          lVar5 = lVar5 + -0x20;
        }
        lVar5 = lVar5 >> 3;
        if (lVar5 == 1) {
LAB_01f4223d:
          if (i != *piVar3) {
            piVar3 = DAT_02223eb8;
          }
LAB_01f42255:
          if (piVar3 == DAT_02223eb8) goto LAB_01f4225a;
        }
        else {
          if (lVar5 == 2) {
LAB_01f42235:
            if (i != *piVar3) {
              piVar3 = piVar3 + 2;
              goto LAB_01f4223d;
            }
            goto LAB_01f42255;
          }
          if (lVar5 == 3) {
            if (i != *piVar3) {
              piVar3 = piVar3 + 2;
              goto LAB_01f42235;
            }
            goto LAB_01f42255;
          }
LAB_01f4225a:
          local_288._M_dataplus._M_p = (pointer)(long)i;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&threadIDs,
                     (unsigned_long *)&local_288);
        }
        iVar1 = std::istream::peek();
        if (iVar1 == 0x2c) {
          std::istream::ignore();
        }
      }
      std::fstream::close();
      std::__cxx11::string::~string((string *)&cpu);
      std::fstream::~fstream((istream *)&set);
      __val = __val + 1;
    }
    std::__cxx11::string::~string((string *)&cpu);
    std::fstream::~fstream(&set);
    piVar3 = DAT_02223eb8;
    for (uVar4 = 0; threadID = local_300, uVar4 < (ulong)((long)piVar3 - (long)threadIDs >> 3);
        uVar4 = uVar4 + 1) {
      for (uVar6 = 0; uVar6 < (ulong)((long)piVar3 - (long)threadIDs >> 3); uVar6 = uVar6 + 1) {
        if (((uVar4 != uVar6) && (piVar3 != threadIDs)) &&
           (*(long *)(threadIDs + uVar4 * 2) == *(long *)(threadIDs + uVar6 * 2))) {
          DAT_02223eb8 = threadIDs;
          piVar3 = threadIDs;
        }
      }
    }
  }
  if (threadID < (ulong)((long)piVar3 - (long)threadIDs >> 3)) {
    threadID = *(size_t *)(threadIDs + threadID * 2);
  }
  set.__bits[0xe] = 0;
  set.__bits[0xf] = 0;
  set.__bits[0xc] = 0;
  set.__bits[0xd] = 0;
  set.__bits[10] = 0;
  set.__bits[0xb] = 0;
  set.__bits[8] = 0;
  set.__bits[9] = 0;
  set.__bits[6] = 0;
  set.__bits[7] = 0;
  set.__bits[4] = 0;
  set.__bits[5] = 0;
  set.__bits[2] = 0;
  set.__bits[3] = 0;
  set.__bits[0] = 0;
  set.__bits[1] = 0;
  __th = pthread_self();
  iVar1 = pthread_getaffinity_np(__th,0x80,(cpu_set_t *)&set);
  sVar8 = threadID;
  if (iVar1 == 0) {
    iVar1 = 0;
    for (uVar4 = 0; sVar8 = threadID, uVar4 != 0x400; uVar4 = uVar4 + 1) {
      if ((set.__bits[uVar4 >> 6] >> (uVar4 & 0x3f) & 1) != 0) {
        sVar8 = uVar4;
        if (threadID == (long)iVar1) break;
        iVar1 = iVar1 + 1;
      }
    }
  }
  Lock<embree::MutexSys>::~Lock(&lock);
  return sVar8;
}

Assistant:

size_t mapThreadID(size_t threadID)
  {
    Lock<MutexSys> lock(mutex);
    
    if (threadIDs.size() == 0)
    {
      /* parse thread/CPU topology */
      for (size_t cpuID=0;;cpuID++)
      {
        std::fstream fs;
        std::string cpu = std::string("/sys/devices/system/cpu/cpu") + std::to_string((long long)cpuID) + std::string("/topology/thread_siblings_list");
        fs.open (cpu.c_str(), std::fstream::in);
        if (fs.fail()) break;

        int i;
        while (fs >> i) 
        {
          if (std::none_of(threadIDs.begin(),threadIDs.end(),[&] (int id) { return id == i; }))
            threadIDs.push_back(i);
          if (fs.peek() == ',') 
            fs.ignore();
        }
        fs.close();
      }

#if 0
      for (size_t i=0;i<threadIDs.size();i++)
        std::cout << i << " -> " << threadIDs[i] << std::endl;
#endif

      /* verify the mapping and do not use it if the mapping has errors */
      for (size_t i=0;i<threadIDs.size();i++) {
        for (size_t j=0;j<threadIDs.size();j++) {
          if (i != j && threadIDs[i] == threadIDs[j]) {
            threadIDs.clear();
          }
        }
      }
    }

    /* re-map threadIDs if mapping is available */
    size_t ID = threadID;
    if (threadID < threadIDs.size())
      ID = threadIDs[threadID];

    /* find correct thread to affinitize to */
    cpu_set_t set;
    CPU_ZERO(&set);
    
    if (pthread_getaffinity_np(pthread_self(), sizeof(set), &set) == 0)
    {
      for (int i=0, j=0; i<CPU_SETSIZE; i++)
      {
        if (!CPU_ISSET(i,&set)) continue;

        if (j == ID) {
          ID = i;
          break;
        }
        j++;
      }
    }

    return ID;
  }